

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_unop(LexState *ls,ExpDesc *v)

{
  BCOp local_1c;
  BCOp op;
  ExpDesc *v_local;
  LexState *ls_local;
  
  if (ls->tok == 0x10f) {
    local_1c = BC_NOT;
  }
  else if (ls->tok == 0x2d) {
    local_1c = BC_UNM;
  }
  else {
    if (ls->tok != 0x23) {
      expr_simple(ls,v);
      return;
    }
    local_1c = BC_LEN;
  }
  lj_lex_next(ls);
  expr_binop(ls,v,8);
  bcemit_unop(ls->fs,local_1c,v);
  return;
}

Assistant:

static void expr_unop(LexState *ls, ExpDesc *v)
{
  BCOp op;
  if (ls->tok == TK_not) {
    op = BC_NOT;
  } else if (ls->tok == '-') {
    op = BC_UNM;
  } else if (ls->tok == '#') {
    op = BC_LEN;
  } else {
    expr_simple(ls, v);
    return;
  }
  lj_lex_next(ls);
  expr_binop(ls, v, UNARY_PRIORITY);
  bcemit_unop(ls->fs, op, v);
}